

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

ll_elem * deref(elem_ptr_t *ptr)

{
  long *plVar1;
  ulong uVar2;
  ll_elem *plVar3;
  ll_elem *plVar4;
  bool bVar5;
  
  do {
    plVar3 = (ll_elem *)*ptr;
    do {
      LOCK();
      plVar4 = (ll_elem *)*ptr;
      bVar5 = plVar3 == plVar4;
      if (bVar5) {
        *ptr = (ulong)plVar3 | 1;
        plVar4 = plVar3;
      }
      UNLOCK();
      plVar3 = plVar4;
    } while (!bVar5);
  } while (((ulong)plVar4 & 1) != 0);
  if (((ulong)plVar4 & 0xfffffffffffffffc) != 0) {
    LOCK();
    plVar1 = (long *)(((ulong)plVar4 & 0xfffffffffffffffc) + 0x10);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
  }
  LOCK();
  uVar2 = *ptr;
  *ptr = *ptr & 0xfffffffffffffffe;
  UNLOCK();
  if ((uVar2 & 1) == 0) {
    __assert_fail("old & DEREF",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0,
                  "struct ll_elem *deref(elem_ptr_t *)");
  }
  return plVar4;
}

Assistant:

static __inline struct ll_elem*
deref(elem_ptr_t *ptr)
{
	uintptr_t e, old;

	while ((e = atomic_fetch_or_explicit(ptr, DEREF,
	    memory_order_consume)) & DEREF)
		SPINWAIT();
	if (ptr_clear((struct ll_elem*)e) != NULL)
		deref_acquire((struct ll_elem*)e, 1);
	old = atomic_fetch_and_explicit(ptr, ~DEREF, memory_order_release);
	assert(old & DEREF);
	return (struct ll_elem*)e;
}